

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TACBuilderVisitor.cpp
# Opt level: O0

TACBuilderVisitor * __thiscall hdc::TACBuilderVisitor::newLabel_abi_cxx11_(TACBuilderVisitor *this)

{
  long in_RSI;
  __cxx11 local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [54];
  allocator local_1a;
  undefined1 local_19;
  TACBuilderVisitor *this_local;
  string *s;
  
  local_19 = 0;
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"L",&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  std::__cxx11::to_string(local_70,*(int *)(in_RSI + 0x10));
  std::operator+(local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this)
  ;
  std::__cxx11::string::operator=((string *)this,(string *)local_50);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)local_70);
  *(int *)(in_RSI + 0x10) = *(int *)(in_RSI + 0x10) + 1;
  return this;
}

Assistant:

std::string TACBuilderVisitor::newLabel() {
    std::string s = "L";
    s = s + std::to_string(labelCounter);
    labelCounter += 1;
    return s;
}